

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::BufferStorageTest::iterate(BufferStorageTest *this)

{
  GLuint *pGVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar6;
  undefined4 extraout_var_01;
  NotSupportedError *pNVar7;
  uint uVar8;
  char *pcVar9;
  pointer ppBVar10;
  uint uVar11;
  qpTestResult testResult;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  if (!bVar2) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"GL_ARB_sparse_buffer is not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_1b0);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (!bVar2) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "GL_ARB_sparse_buffer conformance tests require OpenGL 4.3 core feature-set","");
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_1b0);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTestCases(this);
  pGVar1 = &this->m_sparse_bo;
  uVar11 = 0;
  bVar2 = true;
  do {
    if ((7 >= uVar11) &&
       (uVar8 = (uint)(ushort)(((ushort)uVar11 & 7) << 8) << 4,
       uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333) * 4,
       uVar8 = (uVar8 >> 1 & 0x5540) + (uVar8 & 0x5540) * 2 >> 6, (uVar8 & 0xff) == 0)) {
      uVar8 = (uint)(7 < uVar11) << 6 | uVar8 | 0x400;
      (**(code **)(lVar5 + 0x6c8))(1,pGVar1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a5e);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_sparse_bo);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a61);
      (**(code **)(lVar5 + 0x160))(0x8892,0x3e8c0000,0,uVar8);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBufferStorage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a67);
      ppBVar10 = (this->m_testCases).
                 super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppBVar10 !=
          (this->m_testCases).
          super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          (**(code **)(lVar5 + 0x40))(0x8892,*pGVar1);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glBindBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                          ,0x1a6c);
          iVar3 = (*(*ppBVar10)->_vptr_BufferStorageTestCase[6])(*ppBVar10,(ulong)*pGVar1);
          if ((char)iVar3 == '\0') {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Test case [",0xb);
            iVar3 = (*(*ppBVar10)->_vptr_BufferStorageTestCase[4])();
            pcVar9 = (char *)CONCAT44(extraout_var_01,iVar3);
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
            }
            else {
              sVar6 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"] has failed to initialize.",0x1b);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            pcVar9 = "Fail";
            testResult = QP_TEST_RESULT_FAIL;
            goto LAB_00a4e0b4;
          }
          iVar3 = (*(*ppBVar10)->_vptr_BufferStorageTestCase[3])(*ppBVar10,(ulong)uVar8);
          if ((char)iVar3 == '\0') {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Test case [",0xb);
            iVar3 = (*(*ppBVar10)->_vptr_BufferStorageTestCase[4])();
            pcVar9 = (char *)CONCAT44(extraout_var_00,iVar3);
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)(ostringstream *)local_1a8 +
                              (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
            }
            else {
              sVar6 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"] has failed to execute correctly.",0x22);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar2 = false;
          }
          (*(*ppBVar10)->_vptr_BufferStorageTestCase[7])();
          ppBVar10 = ppBVar10 + 1;
        } while (ppBVar10 !=
                 (this->m_testCases).
                 super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      (**(code **)(lVar5 + 0x438))(1,pGVar1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glDeleteBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a88);
      *pGVar1 = 0;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x10);
  testResult = (byte)~bVar2 & QP_TEST_RESULT_FAIL;
  pcVar9 = "Fail";
  if (bVar2) {
    pcVar9 = "Pass";
  }
LAB_00a4e0b4:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar9);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult BufferStorageTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Only execute if the implementation supports the GL_ARB_sparse_buffer extension */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer"))
	{
		throw tcu::NotSupportedError("GL_ARB_sparse_buffer is not supported");
	}

	/* The buffer storage test cases require OpenGL 4.3 feature-set. */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)))
	{
		throw tcu::NotSupportedError("GL_ARB_sparse_buffer conformance tests require OpenGL 4.3 core feature-set");
	}

	/* Register & initialize the test case objects */
	initTestCases();

	/* Iterate over all sparse BO flag combinations. We need to consider a total of 4 flags:
	 *
	 * - GL_CLIENT_STORAGE_BIT  (bit 0)
	 * - GL_DYNAMIC_STORAGE_BIT (bit 1)
	 * - GL_MAP_COHERENT_BIT    (bit 2)
	 * - GL_MAP_PERSISTENT_BIT  (bit 3)
	 *
	 *  GL_MAP_READ_BIT and GL_MAP_WRITE_BIT are excluded, since they are incompatible
	 *  with sparse buffers by definition.
	 *
	 *  GL_SPARSE_STORAGE_BIT_ARB is assumed to be always defined. Some of the combinations are invalid.
	 *  Such loop iterations will be skipped.
	 * */

	for (unsigned int n_flag_combination = 0; n_flag_combination < (1 << 4); ++n_flag_combination)
	{
		const glw::GLint flags = ((n_flag_combination & (1 << 0)) ? GL_CLIENT_STORAGE_BIT : 0) |
								 ((n_flag_combination & (1 << 1)) ? GL_DYNAMIC_STORAGE_BIT : 0) |
								 ((n_flag_combination & (1 << 2)) ? GL_MAP_COHERENT_BIT : 0) |
								 ((n_flag_combination & (1 << 3)) ? GL_MAP_PERSISTENT_BIT : 0) |
								 GL_SPARSE_STORAGE_BIT_ARB;

		if ((flags & GL_MAP_PERSISTENT_BIT) != 0)
		{
			if ((flags & GL_MAP_READ_BIT) == 0 && (flags & GL_MAP_WRITE_BIT) == 0)
			{
				continue;
			}
		}

		if (((flags & GL_MAP_COHERENT_BIT) != 0) && ((flags & GL_MAP_PERSISTENT_BIT) == 0))
		{
			continue;
		}

		/* Set up the sparse BO */
		gl.genBuffers(1, &m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

		gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

		gl.bufferStorage(GL_ARRAY_BUFFER, 1024768 * 1024, /* as per test spec */
						 DE_NULL,						  /* data */
						 flags);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call failed.");

		for (TestCasesVectorIterator itTestCase = m_testCases.begin(); itTestCase != m_testCases.end(); ++itTestCase)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

			if (!(*itTestCase)->initTestCaseIteration(m_sparse_bo))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Test case [" << (*itTestCase)->getName()
								   << "] "
									  "has failed to initialize."
								   << tcu::TestLog::EndMessage;

				result = false;
				goto end;
			}

			if (!(*itTestCase)->execute(flags))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Test case [" << (*itTestCase)->getName()
								   << "] "
									  "has failed to execute correctly."
								   << tcu::TestLog::EndMessage;

				result = false;
			} /* if (!testCaseResult) */

			(*itTestCase)->deinitTestCaseIteration();
		} /* for (all added test cases) */

		/* Release the sparse BO */
		gl.deleteBuffers(1, &m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers() call failed.");

		m_sparse_bo = 0;
	}

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}